

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

EnergyReport * __thiscall
ot::commissioner::CommissionerApp::GetEnergyReport(CommissionerApp *this,Address *aDstAddr)

{
  const_iterator cVar1;
  EnergyReport *pEVar2;
  
  cVar1 = std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
          ::find(&(this->mEnergyReports)._M_t,aDstAddr);
  pEVar2 = (EnergyReport *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header
     ) {
    pEVar2 = (EnergyReport *)&cVar1._M_node[1]._M_right;
  }
  return pEVar2;
}

Assistant:

const EnergyReport *CommissionerApp::GetEnergyReport(const Address &aDstAddr) const
{
    auto report = mEnergyReports.find(aDstAddr);
    if (report == mEnergyReports.end())
    {
        return nullptr;
    }
    return &report->second;
}